

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
zeGetFabricVertexExpProcAddrTable
          (ze_api_version_t version,ze_fabric_vertex_exp_dditable_t *pDdiTable)

{
  ze_result_t result;
  ze_fabric_vertex_exp_dditable_t *dditable;
  ze_fabric_vertex_exp_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  if (pDdiTable == (ze_fabric_vertex_exp_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (((int)tracing_layer::context >> 0x10 == (int)version >> 0x10) &&
          ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
    _DAT_002da860 = pDdiTable->pfnGetExp;
    pDdiTable->pfnGetExp = tracing_layer::zeFabricVertexGetExp;
    _DAT_002da868 = pDdiTable->pfnGetSubVerticesExp;
    pDdiTable->pfnGetSubVerticesExp = tracing_layer::zeFabricVertexGetSubVerticesExp;
    _DAT_002da870 = pDdiTable->pfnGetPropertiesExp;
    pDdiTable->pfnGetPropertiesExp = tracing_layer::zeFabricVertexGetPropertiesExp;
    _DAT_002da878 = pDdiTable->pfnGetDeviceExp;
    pDdiTable->pfnGetDeviceExp = tracing_layer::zeFabricVertexGetDeviceExp;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetFabricVertexExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_fabric_vertex_exp_dditable_t* pDdiTable      ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.FabricVertexExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetExp                                   = pDdiTable->pfnGetExp;
    pDdiTable->pfnGetExp                                 = tracing_layer::zeFabricVertexGetExp;

    dditable.pfnGetSubVerticesExp                        = pDdiTable->pfnGetSubVerticesExp;
    pDdiTable->pfnGetSubVerticesExp                      = tracing_layer::zeFabricVertexGetSubVerticesExp;

    dditable.pfnGetPropertiesExp                         = pDdiTable->pfnGetPropertiesExp;
    pDdiTable->pfnGetPropertiesExp                       = tracing_layer::zeFabricVertexGetPropertiesExp;

    dditable.pfnGetDeviceExp                             = pDdiTable->pfnGetDeviceExp;
    pDdiTable->pfnGetDeviceExp                           = tracing_layer::zeFabricVertexGetDeviceExp;

    return result;
}